

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O2

BVIndex __thiscall BVFixed::GetNextBit(BVFixed *this,BVIndex i)

{
  BVFixed BVar1;
  long lVar2;
  BVIndex BVar3;
  BVFixed *this_00;
  int iVar4;
  
  AssertRange(this,i);
  this_00 = (BVFixed *)BitsFromIndex(this,i);
  BVar3 = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)this_00,i & 0x3f);
  if (BVar3 == 0xffffffff) {
    iVar4 = -(i & 0xffffffc0);
    do {
      this_00 = this_00 + 1;
      BVar3 = WordCount(this);
      if (this_00 == this + (ulong)BVar3 + 1) {
        return 0xffffffff;
      }
      BVar1 = *this_00;
      iVar4 = iVar4 + -0x40;
    } while (BVar1 == (BVFixed)0x0);
    lVar2 = 0;
    if (BVar1 != (BVFixed)0x0) {
      for (; ((ulong)BVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    BVar3 = (int)lVar2 - iVar4;
  }
  else {
    BVar3 = BVar3 + (i & 0xffffffc0);
  }
  return BVar3;
}

Assistant:

BVIndex
BVFixed::GetNextBit(BVIndex i) const
{
    AssertRange(i);

    const   BVUnit * chunk      = BitsFromIndex(i);
            BVIndex  base       = BVUnit::Floor(i);


    BVIndex offset = chunk->GetNextBit(BVUnit::Offset(i));
    if(-1 != offset)
    {
        return base + offset;
    }

    while(++chunk != this->EndUnit())
    {
        base  += BVUnit::BitsPerWord;
        offset = chunk->GetNextBit();
        if(-1 != offset)
        {
            return base + offset;
        }
    }

   return BVInvalidIndex;
}